

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

void __thiscall Am_Web_Data::Enqueue(Am_Web_Data *this,Input_Port *new_port)

{
  Input_Port *new_port_local;
  Am_Web_Data *this_local;
  
  new_port->changed = true;
  new_port->prev_changed = this->changed_last;
  if (this->changed_last != (Input_Port *)0x0) {
    this->changed_last->next_changed = new_port;
  }
  this->changed_last = new_port;
  if (this->changed_first == (Input_Port *)0x0) {
    this->changed_first = new_port;
  }
  return;
}

Assistant:

void
Am_Web_Data::Enqueue(Input_Port *new_port)
{
  new_port->changed = true;
  new_port->prev_changed = changed_last;
  if (changed_last)
    changed_last->next_changed = new_port;
  changed_last = new_port;
  if (!changed_first)
    changed_first = new_port;
}